

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BandwidthControlTest.cpp
# Opt level: O1

void __thiscall test::BWCTestConnection::OnConnect(BWCTestConnection *this)

{
  ostringstream *this_00;
  size_t sVar1;
  OutputWorker *this_01;
  TonkStatusEx statusEx;
  TonkStatusEx TStack_218;
  undefined1 local_198 [392];
  
  tonk::SDKConnection::GetStatusEx(&TStack_218,&this->super_SDKConnection);
  if (DAT_001bd680 < 2) {
    this_00 = (ostringstream *)(local_198 + 0x10);
    local_198._0_8_ = Logger;
    local_198._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,DAT_001bd6b0,DAT_001bd6b8)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Connected with ",0xf);
    sVar1 = strlen(TStack_218.Remote.NetworkString);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,TStack_218.Remote.NetworkString,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," : ",3);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_198);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  return;
}

Assistant:

void BWCTestConnection::OnConnect()
{
    //TonkStatus status = GetStatus();
    TonkStatusEx statusEx = GetStatusEx();
    Logger.Debug("Connected with ", statusEx.Remote.NetworkString, " : ", statusEx.Remote.UDPPort);
}